

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  App *pAVar1;
  App app;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_518;
  undefined1 *local_510;
  long local_508;
  undefined1 local_500 [16];
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  string local_3d0;
  string local_3b0;
  App local_390;
  
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"");
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"");
  CLI::App::App(&local_390,&local_3b0,&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  local_510 = local_500;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"--help-all","");
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"Show all help","");
  if (local_390.help_all_ptr_ != (Option *)0x0) {
    CLI::App::remove_option(&local_390,local_390.help_all_ptr_);
    local_390.help_all_ptr_ = (Option *)0x0;
  }
  if (local_508 != 0) {
    local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_4f0,local_510,local_510 + local_508);
    local_390.help_all_ptr_ =
         CLI::App::
         add_flag<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                   (&local_390,&local_4f0,&local_3f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
      operator_delete(local_4f0._M_dataplus._M_p);
    }
    ((local_390.help_all_ptr_)->super_OptionBase<CLI::Option>).configurable_ = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  if (local_510 != local_500) {
    operator_delete(local_510);
  }
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x68);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0013ec90;
  local_390.formatter_.super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(this + 1);
  this[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[2]._M_use_count = 0;
  this[2]._M_weak_count = 0;
  this[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[3]._M_use_count = 0;
  this[3]._M_weak_count = 0;
  this[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[5]._M_use_count = 0;
  this[5]._M_weak_count = 0;
  this[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[4]._M_use_count = 0;
  this[4]._M_weak_count = 0;
  this[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[1]._M_use_count = 0;
  this[1]._M_weak_count = 0;
  this[2]._vptr__Sp_counted_base = (_func_int **)0x41;
  this[2]._M_use_count = 0x50;
  this[2]._M_weak_count = 0;
  this[3]._vptr__Sp_counted_base = (_func_int **)0x50;
  this[4]._M_use_count = 0;
  this[4]._M_weak_count = 0;
  this[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[5]._M_use_count = 0;
  this[5]._M_weak_count = 0;
  this[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[3]._M_use_count = 0;
  this[3]._M_weak_count = 0;
  this[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[5]._vptr__Sp_counted_base = (_func_int **)(this + 4);
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this[5]._M_use_count = this + 4;
  this[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[1]._vptr__Sp_counted_base = (_func_int **)&PTR__FormatterBase_0013ece0;
  this[1]._M_use_count = 0xf;
  this[1]._M_weak_count = 0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this->_M_use_count = 2;
  }
  local_518._M_pi = this;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_390.formatter_.
              super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_518);
  if (local_518._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_518._M_pi);
  }
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"--flag","");
  CLI::App::add_flag<const_char[15],_(CLI::detail::enabler)0>
            (&local_390,&local_410,(char (*) [15])"This is a flag");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"one","");
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"Description One","");
  pAVar1 = CLI::App::add_subcommand(&local_390,&local_430,&local_450);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"--oneflag","");
  CLI::App::add_flag<const_char[10],_(CLI::detail::enabler)0>
            (pAVar1,&local_470,(char (*) [10])"Some flag");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p);
  }
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"two","");
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"Description Two","");
  pAVar1 = CLI::App::add_subcommand(&local_390,&local_490,&local_4b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p);
  }
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"--twoflag","");
  CLI::App::add_flag<const_char[16],_(CLI::detail::enabler)0>
            (pAVar1,&local_4d0,(char (*) [16])"Some other flag");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p);
  }
  CLI::App::parse_char_t<char>(&local_390,argc,argv);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"This app was meant to show off the formatter, run with -h",0x39)
  ;
  local_4f0._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_4f0,1);
  CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  CLI::App::~App(&local_390);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    CLI::App app;
    app.set_help_all_flag("--help-all", "Show all help");

    auto fmt = std::make_shared<MyFormatter>();
    fmt->column_width(15);
    app.formatter(fmt);

    app.add_flag("--flag", "This is a flag");

    auto *sub1 = app.add_subcommand("one", "Description One");
    sub1->add_flag("--oneflag", "Some flag");
    auto *sub2 = app.add_subcommand("two", "Description Two");
    sub2->add_flag("--twoflag", "Some other flag");

    CLI11_PARSE(app, argc, argv);

    std::cout << "This app was meant to show off the formatter, run with -h" << '\n';

    return 0;
}